

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O1

int Bac_PtrMemoryArrayArray(Vec_Ptr_t *vArrayArray)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  if (0 < (long)vArrayArray->nSize) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar3 = 0;
      if ((int *)vArrayArray->pArray[lVar2] != (int *)0x0) {
        iVar3 = (int)((double)*vArrayArray->pArray[lVar2] * 8.0 + 16.0);
      }
      iVar1 = iVar1 + iVar3;
      lVar2 = lVar2 + 1;
    } while (vArrayArray->nSize != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Bac_PtrMemoryArrayArray( Vec_Ptr_t * vArrayArray )
{
    Vec_Ptr_t * vArray; int i, nBytes = 0;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vArrayArray, vArray, i )
        nBytes += Bac_PtrMemoryArray(vArray);
    return nBytes;
}